

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O3

mat44 * nifti_mat44_inverse(mat44 R)

{
  float fVar1;
  float fVar2;
  float fVar3;
  mat44 *in_RDI;
  float fVar4;
  float in_stack_00000008;
  float in_stack_0000000c;
  float in_stack_00000010;
  float in_stack_00000014;
  float in_stack_00000018;
  float in_stack_0000001c;
  float in_stack_00000020;
  float in_stack_00000024;
  float in_stack_00000028;
  float in_stack_0000002c;
  float in_stack_00000030;
  float in_stack_00000034;
  
  fVar3 = in_stack_00000018 * in_stack_0000000c;
  fVar2 = in_stack_0000001c * in_stack_00000028;
  fVar4 = in_stack_00000028 * in_stack_0000000c;
  fVar1 = (fVar4 * in_stack_00000020 +
          in_stack_0000002c * in_stack_00000018 * in_stack_00000010 +
          ((in_stack_0000001c * in_stack_00000008 * in_stack_00000030 -
           in_stack_00000020 * in_stack_0000002c * in_stack_00000008) - fVar3 * in_stack_00000030))
          - fVar2 * in_stack_00000010;
  if ((fVar1 != 0.0) || (NAN(fVar1))) {
    fVar1 = 1.0 / fVar1;
  }
  in_RDI->m[0][0] =
       (in_stack_00000030 * in_stack_0000001c + -in_stack_0000002c * in_stack_00000020) * fVar1;
  in_RDI->m[0][1] =
       (-in_stack_0000000c * in_stack_00000030 + in_stack_00000010 * in_stack_0000002c) * fVar1;
  in_RDI->m[0][2] =
       (in_stack_0000000c * in_stack_00000020 + -(in_stack_0000001c * in_stack_00000010)) * fVar1;
  in_RDI->m[0][3] =
       (in_stack_0000002c * in_stack_00000014 * in_stack_00000020 +
       (((in_stack_0000001c * in_stack_00000010 * in_stack_00000034 +
         (in_stack_0000000c * in_stack_00000024 * in_stack_00000030 -
         in_stack_00000020 * in_stack_0000000c * in_stack_00000034)) -
        in_stack_0000001c * in_stack_00000014 * in_stack_00000030) -
       in_stack_00000010 * in_stack_0000002c * in_stack_00000024)) * fVar1;
  in_RDI->m[1][0] =
       (-in_stack_00000018 * in_stack_00000030 + in_stack_00000020 * in_stack_00000028) * fVar1;
  in_RDI->m[1][1] =
       (in_stack_00000008 * in_stack_00000030 + -(in_stack_00000028 * in_stack_00000010)) * fVar1;
  in_RDI->m[1][2] =
       (-in_stack_00000008 * in_stack_00000020 + in_stack_00000010 * in_stack_00000018) * fVar1;
  in_RDI->m[1][3] =
       (-in_stack_00000028 * in_stack_00000014 * in_stack_00000020 +
       in_stack_00000028 * in_stack_00000010 * in_stack_00000024 +
       in_stack_00000018 * in_stack_00000014 * in_stack_00000030 +
       ((in_stack_00000020 * in_stack_00000008 * in_stack_00000034 -
        in_stack_00000008 * in_stack_00000024 * in_stack_00000030) -
       in_stack_00000010 * in_stack_00000018 * in_stack_00000034)) * fVar1;
  in_RDI->m[2][0] = (in_stack_0000002c * in_stack_00000018 + -fVar2) * fVar1;
  in_RDI->m[2][1] = (-in_stack_00000008 * in_stack_0000002c + fVar4) * fVar1;
  in_RDI->m[2][2] = (-fVar3 + in_stack_0000001c * in_stack_00000008) * fVar1;
  in_RDI->m[2][3] =
       ((((fVar3 * in_stack_00000034 +
          (in_stack_0000002c * in_stack_00000008 * in_stack_00000024 -
          in_stack_0000001c * in_stack_00000008 * in_stack_00000034)) -
         in_stack_0000002c * in_stack_00000018 * in_stack_00000014) - in_stack_00000024 * fVar4) +
       in_stack_00000014 * fVar2) * fVar1;
  in_RDI->m[3][2] = 0.0;
  *(float *)((long)(in_RDI->m + 3) + 0) = 0.0;
  *(float *)((long)(in_RDI->m + 3) + 4) = 0.0;
  fVar4 = 1.0;
  if ((fVar1 == 0.0) && (!NAN(fVar1))) {
    fVar4 = 0.0;
  }
  in_RDI->m[3][3] = fVar4;
  return in_RDI;
}

Assistant:

mat44 nifti_mat44_inverse( mat44 R )
{
   double r11,r12,r13,r21,r22,r23,r31,r32,r33,v1,v2,v3 , deti ;
   mat44 Q ;
                                                       /*  INPUT MATRIX IS:  */
   r11 = R.m[0][0]; r12 = R.m[0][1]; r13 = R.m[0][2];  /* [ r11 r12 r13 v1 ] */
   r21 = R.m[1][0]; r22 = R.m[1][1]; r23 = R.m[1][2];  /* [ r21 r22 r23 v2 ] */
   r31 = R.m[2][0]; r32 = R.m[2][1]; r33 = R.m[2][2];  /* [ r31 r32 r33 v3 ] */
   v1  = R.m[0][3]; v2  = R.m[1][3]; v3  = R.m[2][3];  /* [  0   0   0   1 ] */

   deti = r11*r22*r33-r11*r32*r23-r21*r12*r33
         +r21*r32*r13+r31*r12*r23-r31*r22*r13 ;

   if( deti != 0.0l ) deti = 1.0l / deti ;

   Q.m[0][0] = (float)( deti*( r22*r33-r32*r23) ) ;
   Q.m[0][1] = (float)( deti*(-r12*r33+r32*r13) ) ;
   Q.m[0][2] = (float)( deti*( r12*r23-r22*r13) ) ;
   Q.m[0][3] = (float)( deti*(-r12*r23*v3+r12*v2*r33+r22*r13*v3
                     -r22*v1*r33-r32*r13*v2+r32*v1*r23) ) ;

   Q.m[1][0] = (float)( deti*(-r21*r33+r31*r23) ) ;
   Q.m[1][1] = (float)( deti*( r11*r33-r31*r13) ) ;
   Q.m[1][2] = (float)( deti*(-r11*r23+r21*r13) ) ;
   Q.m[1][3] = (float)( deti*( r11*r23*v3-r11*v2*r33-r21*r13*v3
                     +r21*v1*r33+r31*r13*v2-r31*v1*r23) ) ;

   Q.m[2][0] = (float)( deti*( r21*r32-r31*r22) ) ;
   Q.m[2][1] = (float)( deti*(-r11*r32+r31*r12) ) ;
   Q.m[2][2] = (float)( deti*( r11*r22-r21*r12) ) ;
   Q.m[2][3] = (float)( deti*(-r11*r22*v3+r11*r32*v2+r21*r12*v3
                     -r21*r32*v1-r31*r12*v2+r31*r22*v1) ) ;

   Q.m[3][0] = Q.m[3][1] = Q.m[3][2] = 0.0l ;
   Q.m[3][3] = (deti == 0.0l) ? 0.0l : 1.0l ; /* failure flag if deti == 0 */

   return Q ;
}